

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O3

int Aig_ManSizeOfGlobalBdds(Aig_Man_t *p)

{
  undefined8 uVar1;
  int *__ptr;
  DdNode **nodeArray;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  size_t __size;
  int iVar5;
  ulong uVar6;
  
  iVar4 = p->nObjs[3];
  __ptr = (int *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar4 - 1U) {
    iVar5 = iVar4;
  }
  __ptr[1] = 0;
  *__ptr = iVar5;
  uVar6 = 0;
  if (iVar5 == 0) {
    nodeArray = (DdNode **)0x0;
  }
  else {
    nodeArray = (DdNode **)malloc((long)iVar5 << 3);
  }
  *(DdNode ***)(__ptr + 2) = nodeArray;
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    __size = 0;
    iVar4 = 0;
    uVar6 = 0;
    do {
      uVar1 = *(undefined8 *)((long)pVVar2->pArray[uVar6] + 0x28);
      if ((int)uVar6 == iVar5) {
        pvVar3 = *(void **)(__ptr + 2);
        if (uVar6 < 0x10) {
          if (pvVar3 == (void *)0x0) {
            pvVar3 = malloc(0x80);
          }
          else {
            pvVar3 = realloc(pvVar3,0x80);
          }
          *(void **)(__ptr + 2) = pvVar3;
          iVar5 = 0x10;
        }
        else {
          if (pvVar3 == (void *)0x0) {
            pvVar3 = malloc(__size);
          }
          else {
            pvVar3 = realloc(pvVar3,__size);
          }
          *(void **)(__ptr + 2) = pvVar3;
          iVar5 = iVar4;
        }
      }
      else {
        pvVar3 = *(void **)(__ptr + 2);
      }
      *(undefined8 *)((long)pvVar3 + uVar6 * 8) = uVar1;
      uVar6 = uVar6 + 1;
      pVVar2 = p->vCos;
      iVar4 = iVar4 + 2;
      __size = __size + 0x10;
    } while ((long)uVar6 < (long)pVVar2->nSize);
    __ptr[1] = (int)uVar6;
    *__ptr = iVar5;
    nodeArray = *(DdNode ***)(__ptr + 2);
  }
  iVar4 = Cudd_SharingSize(nodeArray,(int)uVar6);
  if (nodeArray != (DdNode **)0x0) {
    free(nodeArray);
  }
  free(__ptr);
  return iVar4;
}

Assistant:

int Aig_ManSizeOfGlobalBdds( Aig_Man_t * p ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Aig_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Aig_ManCoNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_PtrPush( vFuncsGlob, Aig_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}